

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ringbuf.c
# Opt level: O0

adt_buf_err_t
adt_rbfh_createEx(adt_rbfh_t *self,uint8_t u8ElemSize,uint16_t u16MinNumElems,
                 uint16_t u16MaxNumElems)

{
  uint8_t *puVar1;
  uint16_t u16MaxNumElems_local;
  uint16_t u16MinNumElems_local;
  uint8_t u8ElemSize_local;
  adt_rbfh_t *self_local;
  
  if (((self == (adt_rbfh_t *)0x0) || (u8ElemSize == '\0')) ||
     ((u16MaxNumElems != 0 && (u16MaxNumElems <= u16MinNumElems)))) {
    self_local._7_1_ = '\x01';
  }
  else {
    if (u16MinNumElems == 0) {
      self->u8AllocBuf = (uint8_t *)0x0;
    }
    else {
      puVar1 = (uint8_t *)malloc((ulong)((uint)u8ElemSize * (uint)u16MinNumElems));
      self->u8AllocBuf = puVar1;
      if (self->u8AllocBuf == (uint8_t *)0x0) {
        return '\x01';
      }
    }
    self->u16NumElem = 0;
    self->u16AllocLen = u16MinNumElems;
    if (u16MaxNumElems == 0) {
      u16MaxNumElems = 0xffff;
    }
    self->u16MaxNumElem = u16MaxNumElems;
    self->u8ElemSize = u8ElemSize;
    self->u8ReadPtr = self->u8AllocBuf;
    self->u8WritePtr = self->u8AllocBuf;
    self_local._7_1_ = '\0';
  }
  return self_local._7_1_;
}

Assistant:

adt_buf_err_t adt_rbfh_createEx(adt_rbfh_t* self, uint8_t u8ElemSize, uint16_t u16MinNumElems, uint16_t u16MaxNumElems)
{
   if ( (self != 0) && (u8ElemSize > 0) && ( (u16MaxNumElems == 0) || (u16MaxNumElems > u16MinNumElems) ) )
   {
      if (u16MinNumElems > 0)
      {
         self->u8AllocBuf = (uint8_t*) malloc( ((uint32_t)u8ElemSize)*u16MinNumElems);
         if (self->u8AllocBuf == 0)
         {
            return BUF_E_NOT_OK;
         }
      }
      else
      {
         self->u8AllocBuf = (uint8_t*) 0;
      }
      self->u16NumElem = 0;
      self->u16AllocLen = u16MinNumElems;
      self->u16MaxNumElem = (u16MaxNumElems == 0)? USHRT_MAX : u16MaxNumElems;
      self->u8ElemSize = u8ElemSize;
      self->u8ReadPtr = self->u8AllocBuf;
      self->u8WritePtr = self->u8AllocBuf;
      return BUF_E_OK;
   }
   return BUF_E_NOT_OK;
}